

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

size_t brotli::ComputeDistanceCode(size_t distance,size_t max_distance,int quality,int *dist_cache)

{
  size_t candidate;
  size_t idx;
  size_t k;
  int *dist_cache_local;
  int quality_local;
  size_t max_distance_local;
  size_t distance_local;
  
  if (distance <= max_distance) {
    if (distance == (long)*dist_cache) {
      return 0;
    }
    if (distance == (long)dist_cache[1]) {
      return 1;
    }
    if (distance == (long)dist_cache[2]) {
      return 2;
    }
    if (distance == (long)dist_cache[3]) {
      return 3;
    }
    if ((3 < quality) && (5 < distance)) {
      for (idx = 4; idx < 0x10; idx = idx + 1) {
        if ((distance ==
             (long)(dist_cache[*(uint *)(kDistanceCacheIndex + idx * 4)] +
                   *(int *)(kDistanceCacheOffset + idx * 4))) &&
           (ComputeDistanceCode::kLimits[idx] <= distance)) {
          return idx;
        }
      }
    }
  }
  return distance + 0xf;
}

Assistant:

inline size_t ComputeDistanceCode(size_t distance,
                                  size_t max_distance,
                                  int quality,
                                  const int* dist_cache) {
  if (distance <= max_distance) {
    if (distance == static_cast<size_t>(dist_cache[0])) {
      return 0;
    } else if (distance == static_cast<size_t>(dist_cache[1])) {
      return 1;
    } else if (distance == static_cast<size_t>(dist_cache[2])) {
      return 2;
    } else if (distance == static_cast<size_t>(dist_cache[3])) {
      return 3;
    } else if (quality > 3 && distance >= 6) {
      for (size_t k = 4; k < kNumDistanceShortCodes; ++k) {
        size_t idx = kDistanceCacheIndex[k];
        size_t candidate =
            static_cast<size_t>(dist_cache[idx] + kDistanceCacheOffset[k]);
        static const size_t kLimits[16] = {  0,  0,  0,  0,
                                             6,  6, 11, 11,
                                            11, 11, 11, 11,
                                            12, 12, 12, 12 };
        if (distance == candidate && distance >= kLimits[k]) {
          return k;
        }
      }
    }
  }
  return distance + 15;
}